

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::MemoryOperand::display(MemoryOperand *this,ostream *o)

{
  ostream oVar1;
  ostream *in_RSI;
  ostream *in_RDI;
  Reg in_stack_0000000c;
  anon_class_8_1_8991fb9c display_offset;
  ostream *o_00;
  
  o_00 = in_RDI;
  std::operator<<(in_RSI,"[");
  display_reg_name((ostream *)display_offset.this,in_stack_0000000c);
  oVar1 = in_RDI[8];
  if (oVar1 == (ostream)0x0) {
    std::operator<<(in_RSI,", ");
    display::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)in_RSI,o_00);
    std::operator<<(in_RSI,"]");
  }
  else if (oVar1 == (ostream)0x1) {
    std::operator<<(in_RSI,"], ");
    display::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)in_RSI,o_00);
  }
  else if (oVar1 == (ostream)0x2) {
    std::operator<<(in_RSI,", ");
    display::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)in_RSI,o_00);
    std::operator<<(in_RSI,"]!");
  }
  return;
}

Assistant:

void MemoryOperand::display(std::ostream &o) const {
  auto display_offset = [&](std::ostream &o) {
    if (auto x = std::get_if<RegisterOperand>(&offset)) {
      if (neg_rm) o << "-";
      o << *x;
    } else if (auto x = std::get_if<int16_t>(&offset)) {
      o << "#" << *x;
    }
  };
  o << "[";
  display_reg_name(o, r1);
  switch (kind) {
    case MemoryAccessKind::None:
      o << ", ";
      display_offset(o);
      o << "]";
      break;
    case MemoryAccessKind::PostIndex:
      o << ", ";
      display_offset(o);
      o << "]!";
      break;
    case MemoryAccessKind::PreIndex:
      o << "], ";
      display_offset(o);
      break;
  }
}